

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O1

FunctionDefinitionPtr __thiscall Jinx::Impl::Runtime::FindFunction(Runtime *this,RuntimeID id)

{
  element_type *peVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar5;
  bool bVar6;
  FunctionDefinitionPtr FVar7;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(id + 0x1090));
  if (iVar2 == 0) {
    lVar5 = id + 0x10c8;
    lVar3 = lVar5;
    for (lVar4 = *(long *)(id + 0x10d0); lVar4 != 0;
        lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar6 * 8)) {
      bVar6 = *(ulong *)(lVar4 + 0x20) < in_RDX;
      if (!bVar6) {
        lVar3 = lVar4;
      }
    }
    lVar4 = lVar5;
    if ((lVar3 != lVar5) && (lVar4 = lVar3, in_RDX < *(ulong *)(lVar3 + 0x20))) {
      lVar4 = lVar5;
    }
    if (lVar4 == lVar5) {
      (this->super_IRuntime)._vptr_IRuntime = (_func_int **)0x0;
      (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
      ;
    }
    else {
      (this->super_IRuntime)._vptr_IRuntime = *(_func_int ***)(lVar4 + 0x28);
      peVar1 = *(element_type **)(lVar4 + 0x30);
      (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      if (peVar1 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(peVar1->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
                   super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peVar1->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
                        super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
          UNLOCK();
        }
        else {
          *(int *)&(peVar1->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
                   super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peVar1->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
                        super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)(id + 0x1090));
    FVar7.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = extraout_RDX._M_pi;
    FVar7.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (FunctionDefinitionPtr)
           FVar7.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

inline_t FunctionDefinitionPtr Runtime::FindFunction(RuntimeID id) const
	{
		std::lock_guard<std::mutex> lock(m_functionMutex);
		auto itr = m_functionMap.find(id);
		if (itr == m_functionMap.end())
			return nullptr;
		return itr->second;
	}